

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O2

void handle_clipboard_timestamp(int clipboard,Time time)

{
  Clipboard_Notify *pCVar1;
  Clipboard_Notify *pCVar2;
  Time *pTVar3;
  
  pTVar3 = &clipboard_timestamp;
  if (clipboard == 0) {
    pTVar3 = &primary_timestamp;
  }
  if (*pTVar3 == 0xffffffffffffffff && (have_xfixes & 1) == 0) {
    *pTVar3 = time;
  }
  else if (*pTVar3 != time) {
    *pTVar3 = time;
    pCVar2 = clip_notify_list;
    if (time <= fl_event_time) {
      while (pCVar2 != (Clipboard_Notify *)0x0) {
        pCVar1 = pCVar2->next;
        (*pCVar2->handler)(clipboard,pCVar2->data);
        pCVar2 = pCVar1;
      }
      return;
    }
    fl_event_time = time;
    fl_trigger_clipboard_notify(clipboard);
    return;
  }
  return;
}

Assistant:

static void handle_clipboard_timestamp(int clipboard, Time time)
{
  Time *timestamp;

  timestamp = clipboard ? &clipboard_timestamp : &primary_timestamp;

#if HAVE_XFIXES
  if (!have_xfixes)
#endif
  {
    // Initial scan, just store the value
    if (*timestamp == (Time)-1) {
      *timestamp = time;
      return;
    }
  }

  // Same selection
  if (time == *timestamp)
    return;

  *timestamp = time;

  // The clipboard change is the event that caused us to request
  // the clipboard data, so use that time as the latest event.
  if (time > fl_event_time)
    fl_event_time = time;

  // Something happened! Let's tell someone!
  fl_trigger_clipboard_notify(clipboard);
}